

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall
TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test::testBody
          (TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  GlobalSimpleStringMemoryAccountant *this_00;
  GlobalSimpleStringMemoryAccountant GStack_38;
  SimpleString str;
  size_t caches [1];
  
  caches[0] = 0x20;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant;
  GlobalSimpleStringMemoryAccountant::useCacheSizes(this_00,caches,1);
  SimpleString::SimpleString(&str,"");
  GlobalSimpleStringMemoryAccountant::start(this_00);
  SimpleString::operator+=(&str,"More");
  GlobalSimpleStringMemoryAccountant::stop(this_00);
  pUVar1 = UtestShell::getCurrent();
  GlobalSimpleStringMemoryAccountant::report(&GStack_38);
  pcVar2 = SimpleString::asCharString((SimpleString *)&GStack_38);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"32                   1                1                 1",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x98);
  SimpleString::~SimpleString((SimpleString *)&GStack_38);
  SimpleString::~SimpleString(&str);
  return;
}

Assistant:

TEST(GlobalSimpleStringMemoryAccountant, reportUseCaches)
{
    size_t caches[] = {32};
    accountant.useCacheSizes(caches, 1);
    SimpleString str;
    accountant.start();
    str += "More";
    accountant.stop();
    STRCMP_CONTAINS("32                   1                1                 1", accountant.report().asCharString());
}